

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFabUtil.cpp
# Opt level: O0

void amrex::average_cellcenter_to_face
               (Array<MultiFab_*,_3> *fc,MultiFab *cc,Geometry *geom,int ncomp,
               bool use_harmonic_averaging)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined8 uVar7;
  bool bVar8;
  int in_ECX;
  byte in_R8B;
  int i;
  int j;
  int k;
  int n;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Array4<const_double> *ccarr;
  Array4<double> *fzarr;
  Array4<double> *fyarr;
  Array4<double> *fxarr;
  Box b_1;
  Box *index_bounds;
  Box *zbx;
  Box *ybx;
  Box *xbx;
  MFIter mfi;
  Box b;
  Box *__n;
  MFIter *in_stack_fffffffffffff900;
  FabArray<amrex::FArrayBox> *this;
  undefined4 in_stack_fffffffffffff924;
  undefined1 do_tiling_;
  FabArrayBase *in_stack_fffffffffffff928;
  long *plVar9;
  MFIter *in_stack_fffffffffffff930;
  int local_6a8;
  int local_6a4;
  int local_6a0;
  int local_69c;
  undefined8 in_stack_fffffffffffff968;
  int iVar10;
  int in_stack_fffffffffffff970;
  undefined4 in_stack_fffffffffffff974;
  long local_658 [8];
  long *local_618;
  long local_610 [8];
  long *local_5d0;
  long local_5c8 [8];
  long *local_588;
  long local_580 [8];
  long *local_540;
  Box local_538;
  Box *local_510;
  undefined1 local_504 [80];
  Box local_4b4;
  Box *local_498;
  MFIter local_490;
  byte local_42d;
  int local_42c;
  undefined8 local_410;
  int local_408;
  Box *local_400;
  int local_3f4;
  int iStack_3f0;
  int local_3ec;
  undefined8 local_3e8;
  int local_3e0;
  Box *local_3d8;
  int local_3cc;
  int iStack_3c8;
  int local_3c4;
  Box local_3b8;
  FabArray<amrex::FArrayBox> *local_398;
  MFIter *local_390;
  Box *local_388;
  byte local_379;
  long *local_378;
  long *local_370;
  long *local_368;
  long *local_360;
  FabArray<amrex::FArrayBox> *local_358;
  MFIter *local_350;
  Box *local_348;
  int local_33c;
  int local_338;
  int local_334;
  int local_330;
  undefined4 local_32c;
  IntVect *local_328;
  undefined4 local_31c;
  IntVect *local_318;
  undefined4 local_30c;
  IntVect *local_308;
  undefined4 local_2fc;
  Box *local_2f8;
  undefined4 local_2ec;
  Box *local_2e8;
  undefined4 local_2dc;
  Box *local_2d8;
  int local_2d0;
  int local_2cc;
  int local_2c8;
  int local_2c4;
  long *local_2c0;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  long *local_2a8;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  long *local_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  long *local_278;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  long *local_260;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  long *local_248;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  long *local_230;
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  long *local_218;
  int local_210;
  int local_20c;
  int local_208;
  int local_204;
  long *local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long *local_1e8;
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  long *local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  long *local_1b8;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  long *local_1a0;
  int local_198;
  int local_194;
  int local_190;
  int local_18c;
  long *local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  long *local_170;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  long *local_158;
  int local_150;
  int local_14c;
  int local_148;
  int local_144;
  long *local_140;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  long *local_128;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  long *local_110;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  long *local_f8;
  int local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  long *local_e0;
  int local_d8;
  int local_d4;
  int local_d0;
  int local_cc;
  long *local_c8;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  long *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  long *local_98;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  long *local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  long *local_68;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  long *local_50;
  IndexType local_44;
  FabArray<amrex::FArrayBox> *local_40;
  Box *local_38;
  IndexType local_2c;
  MFIter *local_28;
  Box *local_20;
  
  do_tiling_ = (undefined1)((uint)in_stack_fffffffffffff924 >> 0x18);
  local_42d = in_R8B & 1;
  local_42c = in_ECX;
  TilingIfNotGPU();
  MFIter::MFIter(in_stack_fffffffffffff930,in_stack_fffffffffffff928,(bool)do_tiling_);
  do {
    iVar10 = SUB84(in_stack_fffffffffffff968,4);
    bVar8 = MFIter::isValid(&local_490);
    if (!bVar8) {
      MFIter::~MFIter(in_stack_fffffffffffff900);
      return;
    }
    __n = &local_4b4;
    MFIter::nodaltilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),iVar10);
    in_stack_fffffffffffff900 = (MFIter *)(local_504 + 0x28);
    local_498 = __n;
    MFIter::nodaltilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),iVar10);
    this = (FabArray<amrex::FArrayBox> *)local_504;
    local_504._68_8_ = in_stack_fffffffffffff900;
    MFIter::nodaltilebox
              ((MFIter *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),iVar10);
    local_388 = local_498;
    local_390 = (MFIter *)local_504._68_8_;
    local_20 = local_498;
    local_28 = (MFIter *)local_504._68_8_;
    local_3b8.smallend.vect._0_8_ = *(undefined8 *)(local_498->smallend).vect;
    uVar7 = *(undefined8 *)((local_498->smallend).vect + 2);
    local_3b8._20_8_ = *(undefined8 *)((local_498->bigend).vect + 2);
    local_3b8.bigend.vect[1] = (int)((ulong)*(undefined8 *)(local_498->bigend).vect >> 0x20);
    local_3b8.smallend.vect[2] = (int)uVar7;
    local_3b8.bigend.vect[0] = (int)((ulong)uVar7 >> 0x20);
    local_504._28_8_ = this;
    local_398 = this;
    local_2c = Box::ixType((Box *)local_504._68_8_);
    Box::setType(&local_3b8,&local_2c);
    Box::minBox(&local_3b8,(Box *)local_28);
    local_40 = local_398;
    local_538.smallend.vect[0] = local_3b8.smallend.vect[0];
    local_538.smallend.vect[1] = local_3b8.smallend.vect[1];
    local_538.bigend.vect[0] = local_3b8.bigend.vect[0];
    local_538.smallend.vect[2] = local_3b8.smallend.vect[2];
    local_538.bigend.vect[1] = local_3b8.bigend.vect[1];
    local_538.bigend.vect[2] = local_3b8.bigend.vect[2];
    local_538.btype.itype = local_3b8.btype.itype;
    local_38 = &local_3b8;
    local_44 = Box::ixType((Box *)local_398);
    Box::setType(&local_538,&local_44);
    Box::minBox(&local_538,(Box *)local_40);
    local_510 = &local_538;
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff900,(size_type)__n);
    plVar9 = local_580;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffff900);
    local_540 = plVar9;
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff900,(size_type)__n);
    plVar9 = local_5c8;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffff900);
    local_588 = plVar9;
    std::array<amrex::MultiFab_*,_3UL>::operator[]
              ((array<amrex::MultiFab_*,_3UL> *)in_stack_fffffffffffff900,(size_type)__n);
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffff900);
    local_5d0 = local_610;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>(this,in_stack_fffffffffffff900);
    local_400 = local_510;
    local_2d8 = local_510;
    local_2dc = 0;
    iVar10 = (local_510->smallend).vect[0];
    local_2e8 = local_510;
    local_2ec = 1;
    iVar2 = (local_510->smallend).vect[1];
    local_410 = *(undefined8 *)(local_510->smallend).vect;
    local_2f8 = local_510;
    local_2fc = 2;
    iVar3 = (local_510->smallend).vect[2];
    local_3d8 = local_510;
    local_308 = &local_510->bigend;
    local_30c = 0;
    iVar4 = local_308->vect[0];
    local_318 = &local_510->bigend;
    local_31c = 1;
    iVar5 = (local_510->bigend).vect[1];
    in_stack_fffffffffffff968 = *(undefined8 *)local_308->vect;
    local_328 = &local_510->bigend;
    local_32c = 2;
    iVar6 = (local_510->bigend).vect[2];
    in_stack_fffffffffffff970 = iVar6;
    local_618 = local_658;
    local_408 = iVar3;
    local_3f4 = iVar10;
    iStack_3f0 = iVar2;
    local_3ec = iVar3;
    local_3e8 = in_stack_fffffffffffff968;
    local_3e0 = iVar6;
    local_3cc = iVar4;
    iStack_3c8 = iVar5;
    local_3c4 = iVar6;
    for (local_69c = 0; local_6a0 = iVar3, local_69c < local_42c; local_69c = local_69c + 1) {
      for (; local_6a4 = iVar2, local_6a0 <= iVar6; local_6a0 = local_6a0 + 1) {
        for (; local_6a8 = iVar10, local_6a4 <= iVar5; local_6a4 = local_6a4 + 1) {
          for (; local_6a8 <= iVar4; local_6a8 = local_6a8 + 1) {
            local_330 = local_6a8;
            local_334 = local_6a4;
            local_338 = local_6a0;
            local_33c = local_69c;
            local_348 = local_498;
            local_350 = (MFIter *)local_504._68_8_;
            local_358 = (FabArray<amrex::FArrayBox> *)local_504._28_8_;
            local_360 = local_540;
            local_368 = local_588;
            local_370 = local_5d0;
            local_378 = local_618;
            local_379 = local_42d & 1;
            if (local_379 == 0) {
              bVar8 = Box::contains(local_498,local_6a8,local_6a4,local_6a0);
              if (bVar8) {
                local_18c = local_330 + -1;
                local_188 = local_378;
                local_190 = local_334;
                local_194 = local_338;
                local_198 = local_33c;
                local_1a0 = local_378;
                local_1a4 = local_330;
                local_1a8 = local_334;
                local_1ac = local_338;
                local_1b0 = local_33c;
                local_80 = local_360;
                local_84 = local_330;
                local_88 = local_334;
                local_8c = local_338;
                local_90 = local_33c;
                *(double *)
                 (*local_360 +
                 ((long)(local_330 - (int)local_360[4]) +
                  (long)(local_334 - *(int *)((long)local_360 + 0x24)) * local_360[1] +
                  (long)(local_338 - (int)local_360[5]) * local_360[2] +
                 (long)local_33c * local_360[3]) * 8) =
                     (*(double *)
                       (*local_378 +
                       ((long)(local_18c - (int)local_378[4]) +
                        (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                        (long)(local_338 - (int)local_378[5]) * local_378[2] +
                       (long)local_33c * local_378[3]) * 8) +
                     *(double *)
                      (*local_378 +
                      ((long)(local_330 - (int)local_378[4]) +
                       (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                       (long)(local_338 - (int)local_378[5]) * local_378[2] +
                      (long)local_33c * local_378[3]) * 8)) * 0.5;
              }
              bVar8 = Box::contains((Box *)local_350,local_330,local_334,local_338);
              if (bVar8) {
                local_160 = local_334 + -1;
                local_158 = local_378;
                local_15c = local_330;
                local_164 = local_338;
                local_168 = local_33c;
                local_170 = local_378;
                local_174 = local_330;
                local_178 = local_334;
                local_17c = local_338;
                local_180 = local_33c;
                local_68 = local_368;
                local_6c = local_330;
                local_70 = local_334;
                local_74 = local_338;
                local_78 = local_33c;
                *(double *)
                 (*local_368 +
                 ((long)(local_330 - (int)local_368[4]) +
                  (long)(local_334 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                  (long)(local_338 - (int)local_368[5]) * local_368[2] +
                 (long)local_33c * local_368[3]) * 8) =
                     (*(double *)
                       (*local_378 +
                       ((long)(local_330 - (int)local_378[4]) +
                        (long)(local_160 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                        (long)(local_338 - (int)local_378[5]) * local_378[2] +
                       (long)local_33c * local_378[3]) * 8) +
                     *(double *)
                      (*local_378 +
                      ((long)(local_330 - (int)local_378[4]) +
                       (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                       (long)(local_338 - (int)local_378[5]) * local_378[2] +
                      (long)local_33c * local_378[3]) * 8)) * 0.5;
              }
              bVar8 = Box::contains((Box *)local_358,local_330,local_334,local_338);
              if (bVar8) {
                local_134 = local_338 + -1;
                local_128 = local_378;
                local_12c = local_330;
                local_130 = local_334;
                local_138 = local_33c;
                local_140 = local_378;
                local_144 = local_330;
                local_148 = local_334;
                local_14c = local_338;
                local_150 = local_33c;
                local_50 = local_370;
                local_54 = local_330;
                local_58 = local_334;
                local_5c = local_338;
                local_60 = local_33c;
                *(double *)
                 (*local_370 +
                 ((long)(local_330 - (int)local_370[4]) +
                  (long)(local_334 - *(int *)((long)local_370 + 0x24)) * local_370[1] +
                  (long)(local_338 - (int)local_370[5]) * local_370[2] +
                 (long)local_33c * local_370[3]) * 8) =
                     (*(double *)
                       (*local_378 +
                       ((long)(local_330 - (int)local_378[4]) +
                        (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                        (long)(local_134 - (int)local_378[5]) * local_378[2] +
                       (long)local_33c * local_378[3]) * 8) +
                     *(double *)
                      (*local_378 +
                      ((long)(local_330 - (int)local_378[4]) +
                       (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                       (long)(local_338 - (int)local_378[5]) * local_378[2] +
                      (long)local_33c * local_378[3]) * 8)) * 0.5;
              }
            }
            else {
              bVar8 = Box::contains(local_498,local_6a8,local_6a4,local_6a0);
              if (bVar8) {
                local_27c = local_330 + -1;
                local_278 = local_378;
                local_280 = local_334;
                local_284 = local_338;
                local_288 = local_33c;
                dVar1 = *(double *)
                         (*local_378 +
                         ((long)(local_27c - (int)local_378[4]) +
                          (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                          (long)(local_338 - (int)local_378[5]) * local_378[2] +
                         (long)local_33c * local_378[3]) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_290 = local_378;
                  local_294 = local_330;
                  local_298 = local_334;
                  local_29c = local_338;
                  local_2a0 = local_33c;
                  dVar1 = *(double *)
                           (*local_378 +
                           ((long)(local_330 - (int)local_378[4]) +
                            (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                            (long)(local_338 - (int)local_378[5]) * local_378[2] +
                           (long)local_33c * local_378[3]) * 8);
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_2ac = local_330 + -1;
                    local_2a8 = local_378;
                    local_2b0 = local_334;
                    local_2b4 = local_338;
                    local_2b8 = local_33c;
                    local_2c0 = local_378;
                    local_2c4 = local_330;
                    local_2c8 = local_334;
                    local_2cc = local_338;
                    local_2d0 = local_33c;
                    local_f8 = local_360;
                    local_fc = local_330;
                    local_100 = local_334;
                    local_104 = local_338;
                    local_108 = local_33c;
                    *(double *)
                     (*local_360 +
                     ((long)(local_330 - (int)local_360[4]) +
                      (long)(local_334 - *(int *)((long)local_360 + 0x24)) * local_360[1] +
                      (long)(local_338 - (int)local_360[5]) * local_360[2] +
                     (long)local_33c * local_360[3]) * 8) =
                         2.0 / (1.0 / *(double *)
                                       (*local_378 +
                                       ((long)(local_2ac - (int)local_378[4]) +
                                        (long)(local_334 - *(int *)((long)local_378 + 0x24)) *
                                        local_378[1] +
                                        (long)(local_338 - (int)local_378[5]) * local_378[2] +
                                       (long)local_33c * local_378[3]) * 8) +
                               1.0 / *(double *)
                                      (*local_378 +
                                      ((long)(local_330 - (int)local_378[4]) +
                                       (long)(local_334 - *(int *)((long)local_378 + 0x24)) *
                                       local_378[1] +
                                       (long)(local_338 - (int)local_378[5]) * local_378[2] +
                                      (long)local_33c * local_378[3]) * 8));
                    goto LAB_0103816a;
                  }
                }
                local_110 = local_360;
                local_114 = local_330;
                local_118 = local_334;
                local_11c = local_338;
                local_120 = local_33c;
                *(undefined8 *)
                 (*local_360 +
                 ((long)(local_330 - (int)local_360[4]) +
                  (long)(local_334 - *(int *)((long)local_360 + 0x24)) * local_360[1] +
                  (long)(local_338 - (int)local_360[5]) * local_360[2] +
                 (long)local_33c * local_360[3]) * 8) = 0;
              }
LAB_0103816a:
              bVar8 = Box::contains((Box *)local_350,local_330,local_334,local_338);
              if (bVar8) {
                local_220 = local_334 + -1;
                local_218 = local_378;
                local_21c = local_330;
                local_224 = local_338;
                local_228 = local_33c;
                dVar1 = *(double *)
                         (*local_378 +
                         ((long)(local_330 - (int)local_378[4]) +
                          (long)(local_220 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                          (long)(local_338 - (int)local_378[5]) * local_378[2] +
                         (long)local_33c * local_378[3]) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_230 = local_378;
                  local_234 = local_330;
                  local_238 = local_334;
                  local_23c = local_338;
                  local_240 = local_33c;
                  dVar1 = *(double *)
                           (*local_378 +
                           ((long)(local_330 - (int)local_378[4]) +
                            (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                            (long)(local_338 - (int)local_378[5]) * local_378[2] +
                           (long)local_33c * local_378[3]) * 8);
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_250 = local_334 + -1;
                    local_248 = local_378;
                    local_24c = local_330;
                    local_254 = local_338;
                    local_258 = local_33c;
                    local_260 = local_378;
                    local_264 = local_330;
                    local_268 = local_334;
                    local_26c = local_338;
                    local_270 = local_33c;
                    local_c8 = local_368;
                    local_cc = local_330;
                    local_d0 = local_334;
                    local_d4 = local_338;
                    local_d8 = local_33c;
                    *(double *)
                     (*local_368 +
                     ((long)(local_330 - (int)local_368[4]) +
                      (long)(local_334 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                      (long)(local_338 - (int)local_368[5]) * local_368[2] +
                     (long)local_33c * local_368[3]) * 8) =
                         2.0 / (1.0 / *(double *)
                                       (*local_378 +
                                       ((long)(local_330 - (int)local_378[4]) +
                                        (long)(local_250 - *(int *)((long)local_378 + 0x24)) *
                                        local_378[1] +
                                        (long)(local_338 - (int)local_378[5]) * local_378[2] +
                                       (long)local_33c * local_378[3]) * 8) +
                               1.0 / *(double *)
                                      (*local_378 +
                                      ((long)(local_330 - (int)local_378[4]) +
                                       (long)(local_334 - *(int *)((long)local_378 + 0x24)) *
                                       local_378[1] +
                                       (long)(local_338 - (int)local_378[5]) * local_378[2] +
                                      (long)local_33c * local_378[3]) * 8));
                    goto LAB_010385a2;
                  }
                }
                local_e0 = local_368;
                local_e4 = local_330;
                local_e8 = local_334;
                local_ec = local_338;
                local_f0 = local_33c;
                *(undefined8 *)
                 (*local_368 +
                 ((long)(local_330 - (int)local_368[4]) +
                  (long)(local_334 - *(int *)((long)local_368 + 0x24)) * local_368[1] +
                  (long)(local_338 - (int)local_368[5]) * local_368[2] +
                 (long)local_33c * local_368[3]) * 8) = 0;
              }
LAB_010385a2:
              bVar8 = Box::contains((Box *)local_358,local_330,local_334,local_338);
              if (bVar8) {
                local_1c4 = local_338 + -1;
                local_1b8 = local_378;
                local_1bc = local_330;
                local_1c0 = local_334;
                local_1c8 = local_33c;
                dVar1 = *(double *)
                         (*local_378 +
                         ((long)(local_330 - (int)local_378[4]) +
                          (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                          (long)(local_1c4 - (int)local_378[5]) * local_378[2] +
                         (long)local_33c * local_378[3]) * 8);
                if ((dVar1 != 0.0) || (NAN(dVar1))) {
                  local_1d0 = local_378;
                  local_1d4 = local_330;
                  local_1d8 = local_334;
                  local_1dc = local_338;
                  local_1e0 = local_33c;
                  dVar1 = *(double *)
                           (*local_378 +
                           ((long)(local_330 - (int)local_378[4]) +
                            (long)(local_334 - *(int *)((long)local_378 + 0x24)) * local_378[1] +
                            (long)(local_338 - (int)local_378[5]) * local_378[2] +
                           (long)local_33c * local_378[3]) * 8);
                  if ((dVar1 != 0.0) || (NAN(dVar1))) {
                    local_1f4 = local_338 + -1;
                    local_1e8 = local_378;
                    local_1ec = local_330;
                    local_1f0 = local_334;
                    local_1f8 = local_33c;
                    local_200 = local_378;
                    local_204 = local_330;
                    local_208 = local_334;
                    local_20c = local_338;
                    local_210 = local_33c;
                    local_98 = local_370;
                    local_9c = local_330;
                    local_a0 = local_334;
                    local_a4 = local_338;
                    local_a8 = local_33c;
                    *(double *)
                     (*local_370 +
                     ((long)(local_330 - (int)local_370[4]) +
                      (long)(local_334 - *(int *)((long)local_370 + 0x24)) * local_370[1] +
                      (long)(local_338 - (int)local_370[5]) * local_370[2] +
                     (long)local_33c * local_370[3]) * 8) =
                         2.0 / (1.0 / *(double *)
                                       (*local_378 +
                                       ((long)(local_330 - (int)local_378[4]) +
                                        (long)(local_334 - *(int *)((long)local_378 + 0x24)) *
                                        local_378[1] +
                                        (long)(local_1f4 - (int)local_378[5]) * local_378[2] +
                                       (long)local_33c * local_378[3]) * 8) +
                               1.0 / *(double *)
                                      (*local_378 +
                                      ((long)(local_330 - (int)local_378[4]) +
                                       (long)(local_334 - *(int *)((long)local_378 + 0x24)) *
                                       local_378[1] +
                                       (long)(local_338 - (int)local_378[5]) * local_378[2] +
                                      (long)local_33c * local_378[3]) * 8));
                    goto LAB_01039026;
                  }
                }
                local_b0 = local_370;
                local_b4 = local_330;
                local_b8 = local_334;
                local_bc = local_338;
                local_c0 = local_33c;
                *(undefined8 *)
                 (*local_370 +
                 ((long)(local_330 - (int)local_370[4]) +
                  (long)(local_334 - *(int *)((long)local_370 + 0x24)) * local_370[1] +
                  (long)(local_338 - (int)local_370[5]) * local_370[2] +
                 (long)local_33c * local_370[3]) * 8) = 0;
              }
            }
LAB_01039026:
          }
        }
      }
    }
    MFIter::operator++(&local_490);
  } while( true );
}

Assistant:

void average_cellcenter_to_face (const Array<MultiFab*,AMREX_SPACEDIM>& fc, const MultiFab& cc,
                                    const Geometry& geom, int ncomp, bool use_harmonic_averaging)
    {
        AMREX_ASSERT(cc.nComp() == ncomp);
        AMREX_ASSERT(cc.nGrow() >= 1);
        AMREX_ASSERT(fc[0]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#if (AMREX_SPACEDIM >= 2)
        AMREX_ASSERT(fc[1]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif
#if (AMREX_SPACEDIM == 3)
        AMREX_ASSERT(fc[2]->nComp() == ncomp); // We only expect fc to have the gradient perpendicular to the face
#endif


#if (AMREX_SPACEDIM == 1)
        const GeometryData& gd = geom.data();
        if (use_harmonic_averaging) {
            AMREX_ASSERT(gd.Coord() == 0);
        }
#else
        amrex::ignore_unused(geom);
#endif

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion() && cc.isFusingCandidate()) {
            auto const& ccma = cc.const_arrays();
            AMREX_D_TERM(auto const& fxma = fc[0]->arrays();,
                         auto const& fyma = fc[1]->arrays();,
                         auto const& fzma = fc[2]->arrays(););
            MultiFab foo(amrex::convert(cc.boxArray(),IntVect(1)), cc.DistributionMap(), 1, 0,
                         MFInfo().SetAlloc(false));
            IntVect ng = -cc.nGrowVect();
            ParallelFor(foo, IntVect(0), ncomp,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                Box ccbx(ccma[box_no]);
                ccbx.grow(ng);
                AMREX_D_TERM(Box const& xbx = amrex::surroundingNodes(ccbx,0);,
                             Box const& ybx = amrex::surroundingNodes(ccbx,1);,
                             Box const& zbx = amrex::surroundingNodes(ccbx,2););
#if (AMREX_SPACEDIM == 1)
                amrex_avg_cc_to_fc(i,j,k,n, xbx, fxma[box_no], ccma[box_no], gd, use_harmonic_averaging);
#else
                amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                   AMREX_D_DECL(fxma[box_no],fyma[box_no],fzma[box_no]),
                                   ccma[box_no], use_harmonic_averaging);
#endif
            });
            Gpu::streamSynchronize();
        } else
#endif
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(cc,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                AMREX_D_TERM(const Box& xbx = mfi.nodaltilebox(0);,
                             const Box& ybx = mfi.nodaltilebox(1);,
                             const Box& zbx = mfi.nodaltilebox(2););
                const auto& index_bounds = amrex::getIndexBounds(AMREX_D_DECL(xbx,ybx,zbx));

                AMREX_D_TERM(Array4<Real> const& fxarr = fc[0]->array(mfi);,
                             Array4<Real> const& fyarr = fc[1]->array(mfi);,
                             Array4<Real> const& fzarr = fc[2]->array(mfi););
                Array4<Real const> const& ccarr = cc.const_array(mfi);

#if (AMREX_SPACEDIM == 1)
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, xbx, fxarr, ccarr, gd, use_harmonic_averaging);
                });
#else
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D(index_bounds, ncomp, i, j, k, n,
                {
                    amrex_avg_cc_to_fc(i,j,k,n, AMREX_D_DECL(xbx,ybx,zbx),
                                       AMREX_D_DECL(fxarr,fyarr,fzarr), ccarr,
                                       use_harmonic_averaging);
                });
#endif
            }
        }
    }